

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_GetTransactionData_Test::TestBody
          (cfdcapi_elements_transaction_GetTransactionData_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  char *pcVar4;
  char *in_R9;
  AssertionResult gtest_ar_34;
  AssertionResult gtest_ar_33;
  AssertionResult gtest_ar_32;
  char *str_buffer;
  AssertionResult gtest_ar_31;
  AssertionResult gtest_ar_30;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  char *locking_script;
  char *nonce_1;
  char *value_commitment;
  int64_t value_satoshi;
  char *asset_string;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  int64_t token_amount;
  int64_t asset_amount;
  char *token_value;
  char *asset_value;
  char *nonce;
  char *entropy;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  uint32_t locktime;
  uint32_t version;
  uint32_t weight;
  uint32_t vsize;
  uint32_t size;
  char *wit_hash;
  char *wtxid;
  uint32_t sequence;
  uint32_t vout;
  char *script_sig;
  char *txid;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  uint32_t txout_count;
  uint32_t txin_count;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffff658;
  undefined4 *puVar5;
  char **ppcVar6;
  AssertionResult *in_stack_fffffffffffff660;
  char **in_stack_fffffffffffff668;
  char *in_stack_fffffffffffff670;
  void **in_stack_fffffffffffff678;
  undefined7 in_stack_fffffffffffff698;
  undefined1 in_stack_fffffffffffff69f;
  AssertionResult *in_stack_fffffffffffff6f0;
  undefined7 in_stack_fffffffffffff6f8;
  undefined1 in_stack_fffffffffffff6ff;
  uint32_t *in_stack_fffffffffffff778;
  char *in_stack_fffffffffffff780;
  AssertionResult *pAVar7;
  undefined7 in_stack_fffffffffffff788;
  undefined1 in_stack_fffffffffffff78f;
  uint32_t *in_stack_fffffffffffff7d8;
  char *in_stack_fffffffffffff7e0;
  undefined7 in_stack_fffffffffffff7e8;
  undefined1 in_stack_fffffffffffff7ef;
  uint32_t *in_stack_fffffffffffff8b0;
  char **in_stack_fffffffffffff8b8;
  AssertionResult *pAVar8;
  undefined7 in_stack_fffffffffffff8c0;
  undefined1 in_stack_fffffffffffff8c7;
  char **in_stack_fffffffffffff8c8;
  char *in_stack_fffffffffffff8d0;
  undefined7 in_stack_fffffffffffff8d8;
  undefined1 in_stack_fffffffffffff8df;
  undefined7 in_stack_fffffffffffff8f0;
  undefined1 in_stack_fffffffffffff8f7;
  uint32_t *in_stack_fffffffffffff8f8;
  uint32_t *in_stack_fffffffffffff900;
  undefined7 in_stack_fffffffffffff908;
  undefined1 in_stack_fffffffffffff90f;
  AssertionResult *pAVar9;
  undefined7 in_stack_fffffffffffff998;
  char **in_stack_fffffffffffff9a0;
  uint32_t index;
  undefined7 in_stack_fffffffffffff9b0;
  AssertionResult *this_00;
  AssertHelper local_620;
  Message local_618;
  undefined4 local_60c;
  AssertionResult local_608;
  AssertHelper local_5f8;
  Message local_5f0;
  AssertionResult local_5e8;
  AssertHelper local_5d8;
  Message local_5d0;
  undefined4 local_5c4;
  AssertionResult local_5c0;
  char *local_5b0;
  AssertHelper local_5a8;
  Message local_5a0;
  undefined4 local_594;
  AssertionResult local_590;
  AssertHelper local_580;
  Message local_578;
  AssertionResult local_570;
  AssertHelper local_560;
  Message local_558;
  char **in_stack_fffffffffffffab0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffab8;
  AssertHelper in_stack_fffffffffffffac0;
  uint32_t in_stack_fffffffffffffacc;
  char *in_stack_fffffffffffffad0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffad8;
  AssertHelper local_520;
  Message local_518;
  char **in_stack_fffffffffffffaf0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffaf8;
  AssertHelper in_stack_fffffffffffffb00;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb08;
  AssertionResult local_4e8;
  char *local_4d8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d0;
  char *local_4c8;
  undefined8 local_4c0;
  char *local_4b8;
  AssertHelper local_4b0;
  Message local_4a8;
  undefined4 local_49c;
  AssertionResult local_498;
  AssertHelper local_488;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  char **in_stack_fffffffffffffb90;
  uint32_t in_stack_fffffffffffffb9c;
  AssertHelper in_stack_fffffffffffffba0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffba8;
  AssertionResult local_450;
  AssertHelper in_stack_fffffffffffffbc0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffbc8;
  char **in_stack_fffffffffffffbd0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffbd8;
  AssertHelper in_stack_fffffffffffffbe0;
  Message local_418;
  AssertionResult local_410;
  AssertHelper local_400;
  Message local_3f8;
  AssertionResult local_3f0;
  AssertHelper local_3e0;
  Message local_3d8;
  undefined4 local_3cc;
  AssertionResult local_3c8;
  AssertionResult local_3b8;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  AssertHelper local_388;
  Message local_380;
  undefined4 local_374;
  AssertionResult local_370;
  AssertHelper local_360;
  Message local_358;
  AssertionResult local_350;
  AssertHelper local_340;
  Message local_338;
  undefined4 local_32c;
  AssertionResult local_328;
  AssertHelper local_318;
  Message local_310;
  AssertionResult local_308;
  AssertHelper local_2f8;
  Message local_2f0;
  undefined4 local_2e4;
  AssertionResult local_2e0;
  AssertHelper local_2d0;
  Message local_2c8;
  undefined4 local_2bc;
  AssertionResult local_2b8;
  AssertHelper local_2a8;
  Message local_2a0;
  undefined4 local_294;
  AssertionResult local_290;
  AssertHelper local_280;
  Message local_278;
  undefined4 local_26c;
  AssertionResult local_268;
  AssertHelper local_258;
  Message local_250;
  undefined4 local_244;
  AssertionResult local_240;
  AssertHelper local_230;
  Message local_228;
  undefined4 local_21c;
  AssertionResult local_218;
  AssertHelper local_208;
  Message local_200;
  AssertionResult local_1f8;
  AssertHelper local_1e8;
  Message local_1e0;
  AssertionResult local_1d8;
  AssertHelper local_1c8;
  Message local_1c0;
  AssertionResult local_1b8;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined4 local_194;
  AssertionResult local_190;
  char local_17c [4];
  undefined1 local_178 [8];
  undefined4 local_170;
  undefined4 local_16c;
  char *local_168;
  char *local_160;
  undefined4 local_158;
  undefined4 local_154;
  char *local_150;
  char *local_148;
  AssertHelper local_140;
  Message local_138;
  undefined4 local_12c;
  AssertionResult local_128;
  AssertHelper local_118;
  Message local_110;
  undefined4 local_104;
  AssertionResult local_100;
  AssertHelper local_f0;
  Message local_e8;
  undefined4 local_dc;
  AssertionResult local_d8;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b4;
  AssertionResult local_b0;
  undefined4 local_a0;
  undefined4 local_9c;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffff678);
  local_2c = 0;
  pAVar7 = &local_28;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
             (CfdErrorCode *)in_stack_fffffffffffff668,(int *)in_stack_fffffffffffff660);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x33832a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x171,pcVar4);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x33838d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3383e2);
  local_61 = local_10 != 0;
  this_00 = &local_60;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff660,in_stack_fffffffffffff658,(type *)0x338416);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x172,pcVar4);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x338512);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x33858d);
  local_9c = 0;
  local_a0 = 0;
  local_14 = CfdGetConfidentialTxInCount
                       ((void *)CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788),
                        in_stack_fffffffffffff780,in_stack_fffffffffffff778);
  local_b4 = 0;
  pAVar9 = &local_b0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
             (CfdErrorCode *)in_stack_fffffffffffff668,(int *)in_stack_fffffffffffff660);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar9);
  index = (uint32_t)((ulong)pAVar9 >> 0x20);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_c0);
    in_stack_fffffffffffff9a0 =
         (char **)testing::AssertionResult::failure_message((AssertionResult *)0x338673);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x17a,(char *)in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x3386d6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x33872b);
  local_dc = 2;
  pAVar9 = &local_d8;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
             (int *)in_stack_fffffffffffff668,(uint *)in_stack_fffffffffffff660);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(pAVar9);
  if (!(bool)uVar3) {
    testing::Message::Message(&local_e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3387d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x17b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message((Message *)0x33883b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x338893);
  local_14 = CfdGetConfidentialTxOutCount
                       ((void *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                        in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
  local_104 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
             (CfdErrorCode *)in_stack_fffffffffffff668,(int *)in_stack_fffffffffffff660);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x338963);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x17e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::Message::~Message((Message *)0x3389c6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x338a1b);
  local_12c = 4;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
             (int *)in_stack_fffffffffffff668,(uint *)in_stack_fffffffffffff660);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x338ac8);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x17f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message((Message *)0x338b2b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x338b83);
  local_148 = (char *)0x0;
  local_150 = (char *)0x0;
  local_154 = 0;
  local_158 = 0;
  if (local_14 == 0) {
    local_160 = (char *)0x0;
    local_168 = (char *)0x0;
    local_16c = 0;
    local_170 = 0;
    local_178._4_4_ = 0;
    local_178._0_4_ = 0;
    local_17c[0] = '\0';
    local_17c[1] = '\0';
    local_17c[2] = '\0';
    local_17c[3] = '\0';
    in_stack_fffffffffffff670 = local_17c;
    in_stack_fffffffffffff668 = (char **)local_178;
    in_stack_fffffffffffff660 = (AssertionResult *)(local_178 + 4);
    puVar5 = &local_170;
    local_14 = CfdGetConfidentialTxInfo
                         ((void *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                          in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                          (char **)CONCAT17(in_stack_fffffffffffff8c7,in_stack_fffffffffffff8c0),
                          in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,
                          (uint32_t *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
                          in_stack_fffffffffffff8f8,in_stack_fffffffffffff900,
                          (uint32_t *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908))
    ;
    local_194 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
               (CfdErrorCode *)in_stack_fffffffffffff668,(int *)in_stack_fffffffffffff660);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_190);
    if (!bVar1) {
      testing::Message::Message(&local_1a0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x338d28);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,400,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      testing::Message::~Message((Message *)0x338d8b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x338de0);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_1b8,
                 "\"cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992\"","txid",
                 "cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992",local_148);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
      if (!bVar1) {
        testing::Message::Message(&local_1c0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x338e8f);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x192,pcVar4);
        testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
        testing::internal::AssertHelper::~AssertHelper(&local_1c8);
        testing::Message::~Message((Message *)0x338ef2);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x338f47);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_1d8,
                 "\"cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992\"","wtxid",
                 "cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992",local_160);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d8);
      if (!bVar1) {
        testing::Message::Message(&local_1e0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x338fe8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x193,pcVar4);
        testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
        testing::internal::AssertHelper::~AssertHelper(&local_1e8);
        testing::Message::~Message((Message *)0x33904b);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3390a0);
      pAVar8 = &local_1f8;
      testing::internal::CmpHelperSTREQ
                ((internal *)pAVar8,
                 "\"938e3a9b5bac410e812d08db74c4ef2bc58d1ed99d94b637cab0ac2e9eb59df8\"","wit_hash",
                 "938e3a9b5bac410e812d08db74c4ef2bc58d1ed99d94b637cab0ac2e9eb59df8",local_168);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar8);
      if (!bVar1) {
        testing::Message::Message(&local_200);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x339141);
        testing::internal::AssertHelper::AssertHelper
                  (&local_208,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x194,pcVar4);
        testing::internal::AssertHelper::operator=(&local_208,&local_200);
        testing::internal::AssertHelper::~AssertHelper(&local_208);
        testing::Message::~Message((Message *)0x3391a4);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3391f9);
      local_21c = 0x200;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                 (int *)in_stack_fffffffffffff668,(uint *)in_stack_fffffffffffff660);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_218);
      if (!bVar1) {
        testing::Message::Message(&local_228);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3392a6);
        testing::internal::AssertHelper::AssertHelper
                  (&local_230,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x195,pcVar4);
        testing::internal::AssertHelper::operator=(&local_230,&local_228);
        testing::internal::AssertHelper::~AssertHelper(&local_230);
        testing::Message::~Message((Message *)0x339309);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x33935e);
      local_244 = 0x200;
      pAVar8 = &local_240;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                 (int *)in_stack_fffffffffffff668,(uint *)in_stack_fffffffffffff660);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar8);
      if (!bVar1) {
        testing::Message::Message(&local_250);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x33940b);
        testing::internal::AssertHelper::AssertHelper
                  (&local_258,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x196,pcVar4);
        testing::internal::AssertHelper::operator=(&local_258,&local_250);
        testing::internal::AssertHelper::~AssertHelper(&local_258);
        testing::Message::~Message((Message *)0x33946e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3394c3);
      local_26c = 0x800;
      pAVar8 = &local_268;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                 (int *)in_stack_fffffffffffff668,(uint *)in_stack_fffffffffffff660);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar8);
      if (!bVar1) {
        testing::Message::Message(&local_278);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x339570);
        testing::internal::AssertHelper::AssertHelper
                  (&local_280,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x197,pcVar4);
        testing::internal::AssertHelper::operator=(&local_280,&local_278);
        testing::internal::AssertHelper::~AssertHelper(&local_280);
        testing::Message::~Message((Message *)0x3395d3);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x339628);
      local_294 = 2;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                 (int *)in_stack_fffffffffffff668,(uint *)in_stack_fffffffffffff660);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_290);
      if (!bVar1) {
        testing::Message::Message(&local_2a0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3396d5);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x198,pcVar4);
        testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
        testing::internal::AssertHelper::~AssertHelper(&local_2a8);
        testing::Message::~Message((Message *)0x339738);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x33978d);
      local_2bc = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                 (int *)in_stack_fffffffffffff668,(uint *)in_stack_fffffffffffff660,puVar5);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2b8);
      if (!bVar1) {
        testing::Message::Message(&local_2c8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x33983f);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x199,pcVar4);
        testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
        testing::internal::AssertHelper::~AssertHelper(&local_2d0);
        testing::Message::~Message((Message *)0x3398a2);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3398f7);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff668);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff668);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff668);
      local_148 = (char *)0x0;
    }
  }
  if (local_14 == 0) {
    local_14 = CfdGetConfidentialTxIn
                         (this_00,(char *)CONCAT17(uVar2,in_stack_fffffffffffff9b0),index,
                          in_stack_fffffffffffff9a0,
                          (uint32_t *)CONCAT17(uVar3,in_stack_fffffffffffff998),(uint32_t *)pAVar9,
                          (char **)pAVar7);
    local_2e4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
               (CfdErrorCode *)in_stack_fffffffffffff668,(int *)in_stack_fffffffffffff660);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
    if (!bVar1) {
      testing::Message::Message(&local_2f0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x339a2f);
      testing::internal::AssertHelper::AssertHelper
                (&local_2f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x1a4,pcVar4);
      testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
      testing::internal::AssertHelper::~AssertHelper(&local_2f8);
      testing::Message::~Message((Message *)0x339a92);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x339ae7);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_308,
                 "\"57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f\"","txid",
                 "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f",local_148);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_308);
      if (!bVar1) {
        testing::Message::Message(&local_310);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x339b96);
        testing::internal::AssertHelper::AssertHelper
                  (&local_318,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1a6,pcVar4);
        testing::internal::AssertHelper::operator=(&local_318,&local_310);
        testing::internal::AssertHelper::~AssertHelper(&local_318);
        testing::Message::~Message((Message *)0x339bf9);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x339c4e);
      local_32c = 1;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                 (int *)in_stack_fffffffffffff668,(uint *)in_stack_fffffffffffff660);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_328);
      if (!bVar1) {
        testing::Message::Message(&local_338);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x339cfb);
        testing::internal::AssertHelper::AssertHelper
                  (&local_340,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1a7,pcVar4);
        testing::internal::AssertHelper::operator=(&local_340,&local_338);
        testing::internal::AssertHelper::~AssertHelper(&local_340);
        testing::Message::~Message((Message *)0x339d5e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x339db3);
      testing::internal::CmpHelperSTREQ((internal *)&local_350,"\"\"","script_sig","",local_150);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_350);
      if (!bVar1) {
        testing::Message::Message(&local_358);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x339e54);
        testing::internal::AssertHelper::AssertHelper
                  (&local_360,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1a8,pcVar4);
        testing::internal::AssertHelper::operator=(&local_360,&local_358);
        testing::internal::AssertHelper::~AssertHelper(&local_360);
        testing::Message::~Message((Message *)0x339eb7);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x339f0c);
      local_374 = 0xffffffff;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                ((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                 (uint *)in_stack_fffffffffffff668,(uint *)in_stack_fffffffffffff660);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_370);
      if (!bVar1) {
        testing::Message::Message(&local_380);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x339fb9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_388,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1a9,pcVar4);
        testing::internal::AssertHelper::operator=(&local_388,&local_380);
        testing::internal::AssertHelper::~AssertHelper(&local_388);
        testing::Message::~Message((Message *)0x33a01c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x33a071);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff668);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff668);
      local_148 = (char *)0x0;
      local_150 = (char *)0x0;
    }
  }
  if (local_14 == 0) {
    local_390 = (char *)0x0;
    local_398 = (char *)0x0;
    local_3a0 = (char *)0x0;
    local_3a8 = (char *)0x0;
    local_3b8.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_3b8.success_ = false;
    local_3b8._1_7_ = 0;
    in_stack_fffffffffffff668 = &local_3a8;
    in_stack_fffffffffffff660 = &local_3b8;
    ppcVar6 = &local_3a0;
    in_stack_fffffffffffff678 = (void **)0x0;
    in_stack_fffffffffffff670 = (char *)0x0;
    local_14 = CfdGetTxInIssuanceInfo
                         (in_stack_fffffffffffffba8.ptr_,(char *)in_stack_fffffffffffffba0.data_,
                          in_stack_fffffffffffffb9c,in_stack_fffffffffffffb90,
                          (char **)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                          (int64_t *)in_stack_fffffffffffffb80.ptr_,
                          (char **)in_stack_fffffffffffffbc0.data_,
                          (int64_t *)in_stack_fffffffffffffbc8.ptr_,in_stack_fffffffffffffbd0,
                          (char **)in_stack_fffffffffffffbd8.ptr_,
                          (char **)in_stack_fffffffffffffbe0.data_);
    local_3cc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
               (CfdErrorCode *)in_stack_fffffffffffff668,(int *)in_stack_fffffffffffff660);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c8);
    if (!bVar1) {
      testing::Message::Message(&local_3d8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x33a218);
      testing::internal::AssertHelper::AssertHelper
                (&local_3e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x1bb,pcVar4);
      testing::internal::AssertHelper::operator=(&local_3e0,&local_3d8);
      testing::internal::AssertHelper::~AssertHelper(&local_3e0);
      testing::Message::~Message((Message *)0x33a27b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33a2d0);
    if (local_14 == 0) {
      pAVar7 = &local_3f0;
      testing::internal::CmpHelperSTREQ
                ((internal *)pAVar7,
                 "\"6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306\"","entropy",
                 "6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306",local_390);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
      if (!bVar1) {
        testing::Message::Message(&local_3f8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x33a37f);
        testing::internal::AssertHelper::AssertHelper
                  (&local_400,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1bd,pcVar4);
        testing::internal::AssertHelper::operator=(&local_400,&local_3f8);
        testing::internal::AssertHelper::~AssertHelper(&local_400);
        testing::Message::~Message((Message *)0x33a3e2);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x33a437);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_410,
                 "\"0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8\"","nonce",
                 "0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8",local_398);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_410);
      if (!bVar1) {
        testing::Message::Message(&local_418);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x33a4d8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffbe0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1be,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffbe0,&local_418);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbe0);
        testing::Message::~Message((Message *)0x33a53b);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x33a590);
      testing::internal::CmpHelperSTREQ
                ((internal *)&stack0xfffffffffffffbd0,"\"010000000023c34600\"","asset_value",
                 "010000000023c34600",local_3a0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffbd0);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffbc8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x33a631);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffbc0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1bf,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffbc0,(Message *)&stack0xfffffffffffffbc8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc0);
        testing::Message::~Message((Message *)0x33a694);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x33a6e9);
      testing::internal::CmpHelperSTREQ((internal *)&local_450,"\"\"","token_value","",local_3a8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_450);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffba8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x33a78a);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffba0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1c0,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffba0,(Message *)&stack0xfffffffffffffba8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffba0);
        testing::Message::~Message((Message *)0x33a7ed);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x33a842);
      pAVar7 = (AssertionResult *)&stack0xfffffffffffffb90;
      testing::internal::EqHelper<false>::Compare<int,long>
                ((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                 (int *)in_stack_fffffffffffff668,(long *)in_stack_fffffffffffff660);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffb80);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x33a8ef);
        testing::internal::AssertHelper::AssertHelper
                  (&local_488,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1c1,pcVar4);
        testing::internal::AssertHelper::operator=(&local_488,(Message *)&stack0xfffffffffffffb80);
        testing::internal::AssertHelper::~AssertHelper(&local_488);
        testing::Message::~Message((Message *)0x33a952);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x33a9a7);
      local_49c = 0;
      testing::internal::EqHelper<true>::Compare<int,long>
                ((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                 (int *)in_stack_fffffffffffff668,(long *)in_stack_fffffffffffff660,ppcVar6);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_498);
      if (!bVar1) {
        testing::Message::Message(&local_4a8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x33aa59);
        testing::internal::AssertHelper::AssertHelper
                  (&local_4b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1c2,pcVar4);
        testing::internal::AssertHelper::operator=(&local_4b0,&local_4a8);
        testing::internal::AssertHelper::~AssertHelper(&local_4b0);
        testing::Message::~Message((Message *)0x33aabc);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x33ab11);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff668);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff668);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff668);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff668);
    }
  }
  if (local_14 == 0) {
    local_4b8 = (char *)0x0;
    local_4c0 = 0;
    local_4c8 = (char *)0x0;
    local_4d0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_4d8 = (char *)0x0;
    in_stack_fffffffffffff660 = (AssertionResult *)&local_4d8;
    in_stack_fffffffffffff670 = (char *)0x0;
    in_stack_fffffffffffff668 = (char **)0x0;
    local_14 = CfdGetConfidentialTxOut
                         (in_stack_fffffffffffffad8.ptr_,in_stack_fffffffffffffad0,
                          in_stack_fffffffffffffacc,(char **)in_stack_fffffffffffffac0.data_,
                          (int64_t *)in_stack_fffffffffffffab8.ptr_,in_stack_fffffffffffffab0,
                          in_stack_fffffffffffffaf0,(char **)in_stack_fffffffffffffaf8.ptr_,
                          (char **)in_stack_fffffffffffffb00.data_,
                          (char **)in_stack_fffffffffffffb08.ptr_);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
               (CfdErrorCode *)in_stack_fffffffffffff668,(int *)in_stack_fffffffffffff660);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4e8);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffb08);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x33aca2);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffb00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x1d4,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffb00,(Message *)&stack0xfffffffffffffb08);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffb00);
      testing::Message::~Message((Message *)0x33ad05);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33ad5a);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&stack0xfffffffffffffaf0,
                 "\"accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd\"",
                 "asset_string","accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd",
                 local_4b8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffaf0);
      if (!bVar1) {
        testing::Message::Message(&local_518);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x33ae09);
        testing::internal::AssertHelper::AssertHelper
                  (&local_520,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1d6,pcVar4);
        testing::internal::AssertHelper::operator=(&local_520,&local_518);
        testing::internal::AssertHelper::~AssertHelper(&local_520);
        testing::Message::~Message((Message *)0x33ae6c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x33aec1);
      testing::internal::CmpHelperSTREQ
                ((internal *)&stack0xfffffffffffffad0,"\"010000000023c34600\"","value_commitment",
                 "010000000023c34600",local_4c8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffad0);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffac8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x33af62);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffac0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1d7,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffac0,(Message *)&stack0xfffffffffffffac8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffac0);
        testing::Message::~Message((Message *)0x33afc5);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x33b01a);
      testing::internal::CmpHelperSTREQ
                ((internal *)&stack0xfffffffffffffab0,
                 "\"03ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed879\"","nonce",
                 "03ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed879",
                 (char *)local_4d0.ptr_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffab0);
      if (!bVar1) {
        testing::Message::Message(&local_558);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x33b0bb);
        testing::internal::AssertHelper::AssertHelper
                  (&local_560,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1d8,pcVar4);
        testing::internal::AssertHelper::operator=(&local_560,&local_558);
        testing::internal::AssertHelper::~AssertHelper(&local_560);
        testing::Message::~Message((Message *)0x33b11e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x33b173);
      in_stack_fffffffffffff6f0 = &local_570;
      testing::internal::CmpHelperSTREQ
                ((internal *)in_stack_fffffffffffff6f0,
                 "\"76a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac\"","locking_script",
                 "76a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac",local_4d8);
      in_stack_fffffffffffff6ff =
           testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff6f0);
      if (!(bool)in_stack_fffffffffffff6ff) {
        testing::Message::Message(&local_578);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x33b214);
        testing::internal::AssertHelper::AssertHelper
                  (&local_580,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1d9,pcVar4);
        testing::internal::AssertHelper::operator=(&local_580,&local_578);
        testing::internal::AssertHelper::~AssertHelper(&local_580);
        testing::Message::~Message((Message *)0x33b277);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x33b2cc);
      local_594 = 600000000;
      testing::internal::EqHelper<false>::Compare<int,long>
                ((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                 (int *)in_stack_fffffffffffff668,(long *)in_stack_fffffffffffff660);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_590);
      if (!bVar1) {
        testing::Message::Message(&local_5a0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x33b379);
        testing::internal::AssertHelper::AssertHelper
                  (&local_5a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1da,pcVar4);
        testing::internal::AssertHelper::operator=(&local_5a8,&local_5a0);
        testing::internal::AssertHelper::~AssertHelper(&local_5a8);
        testing::Message::~Message((Message *)0x33b3d6);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x33b42b);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff668);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff668);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff668);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff668);
    }
  }
  local_14 = CfdGetLastErrorCode((void *)CONCAT17(in_stack_fffffffffffff69f,
                                                  in_stack_fffffffffffff698));
  if (local_14 != 0) {
    local_5b0 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage
                         ((void *)CONCAT17(in_stack_fffffffffffff6ff,in_stack_fffffffffffff6f8),
                          (char **)in_stack_fffffffffffff6f0);
    local_5c4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
               (CfdErrorCode *)in_stack_fffffffffffff668,(int *)in_stack_fffffffffffff660);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5c0);
    if (!bVar1) {
      testing::Message::Message(&local_5d0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x33b54e);
      testing::internal::AssertHelper::AssertHelper
                (&local_5d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x1e7,pcVar4);
      testing::internal::AssertHelper::operator=(&local_5d8,&local_5d0);
      testing::internal::AssertHelper::~AssertHelper(&local_5d8);
      testing::Message::~Message((Message *)0x33b5ab);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33b600);
    testing::internal::CmpHelperSTREQ((internal *)&local_5e8,"\"\"","str_buffer","",local_5b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5e8);
    if (!bVar1) {
      testing::Message::Message(&local_5f0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x33b695);
      testing::internal::AssertHelper::AssertHelper
                (&local_5f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x1e8,pcVar4);
      testing::internal::AssertHelper::operator=(&local_5f8,&local_5f0);
      testing::internal::AssertHelper::~AssertHelper(&local_5f8);
      testing::Message::~Message((Message *)0x33b6f2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33b747);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffff668);
    local_5b0 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffff668);
  local_60c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670,
             (CfdErrorCode *)in_stack_fffffffffffff668,(int *)in_stack_fffffffffffff660);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_608);
  if (!bVar1) {
    testing::Message::Message(&local_618);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x33b817);
    testing::internal::AssertHelper::AssertHelper
              (&local_620,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x1ee,pcVar4);
    testing::internal::AssertHelper::operator=(&local_620,&local_618);
    testing::internal::AssertHelper::~AssertHelper(&local_620);
    testing::Message::~Message((Message *)0x33b874);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x33b8c9);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, GetTransactionData) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  static const char* tx_data = "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000";

  uint32_t txin_count = 0;
  uint32_t txout_count = 0;

  ret = CfdGetConfidentialTxInCount(handle, tx_data, &txin_count);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_EQ(2, txin_count);

  ret = CfdGetConfidentialTxOutCount(handle, tx_data, &txout_count);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_EQ(4, txout_count);

  char* txid = nullptr;
  char* script_sig = nullptr;
  uint32_t vout = 0;
  uint32_t sequence = 0;
  if (ret == kCfdSuccess) {
    char* wtxid = nullptr;
    char* wit_hash = nullptr;
    uint32_t size = 0;
    uint32_t vsize = 0;
    uint32_t weight = 0;
    uint32_t version = 0;
    uint32_t locktime = 0;
    ret = CfdGetConfidentialTxInfo(
        handle, tx_data, &txid, &wtxid, &wit_hash, &size, &vsize, &weight,
        &version, &locktime);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992", txid);
      EXPECT_STREQ("cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992", wtxid);
      EXPECT_STREQ("938e3a9b5bac410e812d08db74c4ef2bc58d1ed99d94b637cab0ac2e9eb59df8", wit_hash);
      EXPECT_EQ(512, size);
      EXPECT_EQ(512, vsize);
      EXPECT_EQ(2048, weight);
      EXPECT_EQ(2, version);
      EXPECT_EQ(0, locktime);

      CfdFreeStringBuffer(txid);
      CfdFreeStringBuffer(wtxid);
      CfdFreeStringBuffer(wit_hash);
      txid = nullptr;
    }
  }
  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxIn(
        handle, tx_data, 1, &txid, &vout, &sequence, &script_sig);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", txid);
      EXPECT_EQ(1, vout);
      EXPECT_STREQ("", script_sig);
      EXPECT_EQ(4294967295U, sequence);

      CfdFreeStringBuffer(txid);
      CfdFreeStringBuffer(script_sig);
      txid = nullptr;
      script_sig = nullptr;
    }
  }
  if (ret == kCfdSuccess) {
    char* entropy = nullptr;
    char* nonce = nullptr;
    char* asset_value = nullptr;
    char* token_value = nullptr;
    int64_t asset_amount = 0;
    int64_t token_amount = 0;
    ret = CfdGetTxInIssuanceInfo(
        handle, tx_data, 1, &entropy, &nonce, &asset_amount, &asset_value,
        &token_amount, &token_value, nullptr, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306", entropy);
      EXPECT_STREQ("0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8", nonce);
      EXPECT_STREQ("010000000023c34600", asset_value);
      EXPECT_STREQ("", token_value);
      EXPECT_EQ(600000000, asset_amount);
      EXPECT_EQ(0, token_amount);

      CfdFreeStringBuffer(entropy);
      CfdFreeStringBuffer(nonce);
      CfdFreeStringBuffer(asset_value);
      CfdFreeStringBuffer(token_value);
    }
  }

  if (ret == kCfdSuccess) {
    char* asset_string = nullptr;
    int64_t value_satoshi = 0;
    char* value_commitment = nullptr;
    char* nonce = nullptr;
    char* locking_script = nullptr;
    ret = CfdGetConfidentialTxOut(
        handle, tx_data, 3, &asset_string, &value_satoshi, &value_commitment,
        &nonce, &locking_script, nullptr, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd", asset_string);
      EXPECT_STREQ("010000000023c34600", value_commitment);
      EXPECT_STREQ("03ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed879", nonce);
      EXPECT_STREQ("76a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac", locking_script);
      EXPECT_EQ(600000000, value_satoshi);

      CfdFreeStringBuffer(asset_string);
      CfdFreeStringBuffer(value_commitment);
      CfdFreeStringBuffer(nonce);
      CfdFreeStringBuffer(locking_script);
    }
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}